

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall MyXmlParser::onStartElement(MyXmlParser *this,char *name,char **attributes)

{
  long *in_RDX;
  undefined8 in_RSI;
  MyXmlParser *in_RDI;
  long *local_18;
  
  printIndent(in_RDI);
  printf("<%s",in_RSI);
  if (*in_RDX != 0) {
    printf("\n");
    in_RDI->m_indent = in_RDI->m_indent + 1;
    for (local_18 = in_RDX; *local_18 != 0; local_18 = local_18 + 2) {
      printIndent(in_RDI);
      printf("%s = %s\n",*local_18,local_18[1]);
    }
    in_RDI->m_indent = in_RDI->m_indent - 1;
    printIndent(in_RDI);
  }
  printf(">\n");
  in_RDI->m_indent = in_RDI->m_indent + 1;
  return;
}

Assistant:

void
	onStartElement(
		const char* name,
		const char** attributes
	) {
		printIndent();
		printf("<%s", name);

		if (*attributes) {
			printf("\n");
			m_indent++;

			while (*attributes) {
				printIndent();
				printf("%s = %s\n", attributes [0], attributes [1]);
				attributes += 2;
			}

			m_indent--;
			printIndent();
		}

		printf(">\n");
		m_indent++;
	}